

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O0

void __thiscall
Hospital::Remove_Nurse
          (Hospital *this,vector<Nurse,_std::allocator<Nurse>_> *All_Of_Nurses,string *id)

{
  string *this_00;
  __type _Var1;
  ulong uVar2;
  size_type sVar3;
  reference this_01;
  reference __lhs;
  __normal_iterator<Nurse_*,_std::vector<Nurse,_std::allocator<Nurse>_>_> local_58;
  __normal_iterator<Nurse_*,_std::vector<Nurse,_std::allocator<Nurse>_>_> local_50;
  const_iterator local_48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  int local_24;
  string *psStack_20;
  int i;
  string *id_local;
  vector<Nurse,_std::allocator<Nurse>_> *All_Of_Nurses_local;
  Hospital *this_local;
  
  local_24 = 0;
  psStack_20 = id;
  id_local = (string *)All_Of_Nurses;
  All_Of_Nurses_local = (vector<Nurse,_std::allocator<Nurse>_> *)this;
  while( true ) {
    uVar2 = (ulong)local_24;
    sVar3 = std::vector<Nurse,_std::allocator<Nurse>_>::size
                      ((vector<Nurse,_std::allocator<Nurse>_> *)id_local);
    if (sVar3 <= uVar2) {
      return;
    }
    this_01 = std::vector<Nurse,_std::allocator<Nurse>_>::operator[]
                        ((vector<Nurse,_std::allocator<Nurse>_> *)id_local,(long)local_24);
    Nurse::nurse_all_ino_getter_abi_cxx11_(&local_40,this_01);
    __lhs = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](&local_40,0);
    _Var1 = std::operator==(__lhs,id);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_40);
    this_00 = id_local;
    if (_Var1) break;
    local_24 = local_24 + 1;
  }
  local_58._M_current =
       (Nurse *)std::vector<Nurse,_std::allocator<Nurse>_>::begin
                          ((vector<Nurse,_std::allocator<Nurse>_> *)id_local);
  local_50 = __gnu_cxx::__normal_iterator<Nurse_*,_std::vector<Nurse,_std::allocator<Nurse>_>_>::
             operator+(&local_58,(long)local_24);
  __gnu_cxx::__normal_iterator<Nurse_const*,std::vector<Nurse,std::allocator<Nurse>>>::
  __normal_iterator<Nurse*>
            ((__normal_iterator<Nurse_const*,std::vector<Nurse,std::allocator<Nurse>>> *)&local_48,
             &local_50);
  std::vector<Nurse,_std::allocator<Nurse>_>::erase
            ((vector<Nurse,_std::allocator<Nurse>_> *)this_00,local_48);
  return;
}

Assistant:

void Hospital :: Remove_Nurse(vector<Nurse>& All_Of_Nurses , string id){

    for (int i = 0; i <All_Of_Nurses.size() ; ++i) {
        if(All_Of_Nurses[i].nurse_all_ino_getter()[0] == id){
            All_Of_Nurses.erase(All_Of_Nurses.begin()+i);
            ///remove from files
            break;
        }
    }
}